

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O0

bool IsOperaSoftTrack(Track *track)

{
  bool bVar1;
  int iVar2;
  reference pSVar3;
  Sector *s;
  const_iterator __end1;
  const_iterator __begin1;
  Track *__range1;
  int i;
  uint32_t sector_mask;
  Track *track_local;
  
  __range1._4_4_ = 0;
  __range1._0_4_ = 0;
  iVar2 = Track::size(track);
  if (iVar2 == 9) {
    __end1 = Track::begin(track);
    s = (Sector *)Track::end(track);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>
                                       *)&s), bVar1) {
      pSVar3 = __gnu_cxx::
               __normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>::
               operator*(&__end1);
      if ((pSVar3->datarate != _250K) || (pSVar3->encoding != MFM)) {
        return false;
      }
      if ((pSVar3->header).size != (uint)"\x01\x01\x01\x01\x01\x01\x01\x01\b"[(int)__range1]) {
        return false;
      }
      __range1._4_4_ = 1 << ((byte)(pSVar3->header).sector & 0x1f) | __range1._4_4_;
      __gnu_cxx::__normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>::
      operator++(&__end1);
      __range1._0_4_ = (int)__range1 + 1;
    }
    if (__range1._4_4_ == 0x1ff) {
      if (opt.debug != 0) {
        util::operator<<((LogHelper *)&util::cout,
                         (char (*) [42])"detected OperaSoft track with 32K sector\n");
      }
      track_local._7_1_ = true;
    }
    else {
      track_local._7_1_ = false;
    }
  }
  else {
    track_local._7_1_ = false;
  }
  return track_local._7_1_;
}

Assistant:

bool IsOperaSoftTrack(const Track& track)
{
    uint32_t sector_mask = 0;
    int i = 0;

    if (track.size() != 9)
        return false;

    for (auto& s : track)
    {
        if (s.datarate != DataRate::_250K || s.encoding != Encoding::MFM)
            return false;

        static const uint8_t sizes[] = { 1,1,1,1,1,1,1,1,8 };
        if (s.header.size != sizes[i++])
            return false;

        sector_mask |= (1 << s.header.sector);
    }

    // Sectors must be numbered 0 to 8
    if (sector_mask != ((1 << 9) - 1))
        return false;

    if (opt.debug) util::cout << "detected OperaSoft track with 32K sector\n";
    return true;
}